

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_sat(DisasContext_conflict1 *s,arg_sat *a,
            _func_void_TCGContext_ptr_TCGv_i32_TCGv_env_TCGv_i32_TCGv_i32_conflict *gen)

{
  TCGContext_conflict1 *tcg_ctx_00;
  int iVar1;
  TCGv_i32 ret;
  TCGv_i32 arg;
  int32_t local_64;
  int shift;
  TCGv_i32 satimm;
  TCGv_i32 tmp;
  TCGContext_conflict1 *tcg_ctx;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_env_TCGv_i32_TCGv_i32_conflict *gen_local;
  arg_sat *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  local_64 = a->imm;
  iVar1 = arm_dc_feature(s,3);
  if (iVar1 == 0) {
    s_local._7_1_ = false;
  }
  else {
    ret = load_reg(s,a->rn);
    if (a->sh == 0) {
      tcg_gen_shli_i32_aarch64(tcg_ctx_00,ret,ret,local_64);
    }
    else {
      if (local_64 == 0) {
        local_64 = 0x1f;
      }
      tcg_gen_sari_i32_aarch64(tcg_ctx_00,ret,ret,local_64);
    }
    arg = tcg_const_i32_aarch64(tcg_ctx_00,a->satimm);
    (*gen)(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,ret,arg);
    tcg_temp_free_i32(tcg_ctx_00,arg);
    store_reg(s,a->rd,ret);
    s_local._7_1_ = true;
  }
  return s_local._7_1_;
}

Assistant:

static bool op_sat(DisasContext *s, arg_sat *a,
                   void (*gen)(TCGContext *, TCGv_i32, TCGv_env, TCGv_i32, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp, satimm;
    int shift = a->imm;

    if (!ENABLE_ARCH_6) {
        return false;
    }

    tmp = load_reg(s, a->rn);
    if (a->sh) {
        tcg_gen_sari_i32(tcg_ctx, tmp, tmp, shift ? shift : 31);
    } else {
        tcg_gen_shli_i32(tcg_ctx, tmp, tmp, shift);
    }

    satimm = tcg_const_i32(tcg_ctx, a->satimm);
    gen(tcg_ctx, tmp, tcg_ctx->cpu_env, tmp, satimm);
    tcg_temp_free_i32(tcg_ctx, satimm);

    store_reg(s, a->rd, tmp);
    return true;
}